

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_1x1_pack4.h
# Opt level: O3

void ncnn::conv1x1s1_sgemm_transform_kernel_pack4_sse
               (Mat *kernel,Mat *kernel_pack4,int inch,int outch)

{
  void *pvVar1;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  int iVar5;
  void *pvVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  
  iVar7 = inch + 3;
  if (-1 < inch) {
    iVar7 = inch;
  }
  iVar5 = outch + 3;
  if (-1 < outch) {
    iVar5 = outch;
  }
  Mat::create(kernel_pack4,1,iVar7 >> 2,iVar5 >> 2,0x40,0x10,(Allocator *)0x0);
  if (3 < outch) {
    pvVar1 = kernel->data;
    pvVar6 = kernel_pack4->data;
    sVar2 = kernel_pack4->cstep;
    sVar3 = kernel_pack4->elemsize;
    lVar11 = (long)inch;
    lVar8 = (long)pvVar1 + lVar11 * 0xc + 0xc;
    lVar9 = (long)pvVar1 + lVar11 * 8 + 0xc;
    lVar10 = (long)pvVar1 + lVar11 * 4 + 0xc;
    lVar11 = lVar11 * 0x10;
    lVar4 = (long)pvVar1 + 0xc;
    lVar12 = 0;
    do {
      if (3 < inch) {
        iVar7 = 3;
        lVar14 = 0;
        do {
          *(undefined4 *)((long)pvVar6 + lVar14 * 4) = *(undefined4 *)(lVar4 + -0xc + lVar14);
          *(undefined4 *)((long)pvVar6 + lVar14 * 4 + 4) = *(undefined4 *)(lVar10 + -0xc + lVar14);
          *(undefined4 *)((long)pvVar6 + lVar14 * 4 + 8) = *(undefined4 *)(lVar9 + -0xc + lVar14);
          *(undefined4 *)((long)pvVar6 + lVar14 * 4 + 0xc) = *(undefined4 *)(lVar8 + -0xc + lVar14);
          *(undefined4 *)((long)pvVar6 + lVar14 * 4 + 0x10) = *(undefined4 *)(lVar4 + -8 + lVar14);
          *(undefined4 *)((long)pvVar6 + lVar14 * 4 + 0x14) = *(undefined4 *)(lVar10 + -8 + lVar14);
          *(undefined4 *)((long)pvVar6 + lVar14 * 4 + 0x18) = *(undefined4 *)(lVar9 + -8 + lVar14);
          *(undefined4 *)((long)pvVar6 + lVar14 * 4 + 0x1c) = *(undefined4 *)(lVar8 + -8 + lVar14);
          *(undefined4 *)((long)pvVar6 + lVar14 * 4 + 0x20) = *(undefined4 *)(lVar4 + -4 + lVar14);
          *(undefined4 *)((long)pvVar6 + lVar14 * 4 + 0x24) = *(undefined4 *)(lVar10 + -4 + lVar14);
          *(undefined4 *)((long)pvVar6 + lVar14 * 4 + 0x28) = *(undefined4 *)(lVar9 + -4 + lVar14);
          *(undefined4 *)((long)pvVar6 + lVar14 * 4 + 0x2c) = *(undefined4 *)(lVar8 + -4 + lVar14);
          *(undefined4 *)((long)pvVar6 + lVar14 * 4 + 0x30) = *(undefined4 *)(lVar4 + lVar14);
          *(undefined4 *)((long)pvVar6 + lVar14 * 4 + 0x34) = *(undefined4 *)(lVar10 + lVar14);
          *(undefined4 *)((long)pvVar6 + lVar14 * 4 + 0x38) = *(undefined4 *)(lVar9 + lVar14);
          *(undefined4 *)((long)pvVar6 + lVar14 * 4 + 0x3c) = *(undefined4 *)(lVar8 + lVar14);
          iVar7 = iVar7 + 4;
          lVar14 = lVar14 + 0x10;
        } while (iVar7 < inch);
      }
      uVar13 = lVar12 + 7;
      pvVar6 = (void *)((long)pvVar6 + sVar2 * sVar3);
      lVar8 = lVar8 + lVar11;
      lVar9 = lVar9 + lVar11;
      lVar10 = lVar10 + lVar11;
      lVar4 = lVar4 + lVar11;
      lVar12 = lVar12 + 4;
    } while (uVar13 < (uint)outch);
  }
  return;
}

Assistant:

static void conv1x1s1_sgemm_transform_kernel_pack4_sse(const Mat& kernel, Mat& kernel_pack4, int inch, int outch)
{
    // interleave
    // src = inch-outch
    // dst = 4b-4a-inch/4a-outch/4b
    kernel_pack4.create(1, inch / 4, outch / 4, (size_t)4u * 16, 16);

    int q = 0;
    for (; q + 3 < outch; q += 4)
    {
        const float* k0 = (const float*)kernel + (q + 0) * inch;
        const float* k1 = (const float*)kernel + (q + 1) * inch;
        const float* k2 = (const float*)kernel + (q + 2) * inch;
        const float* k3 = (const float*)kernel + (q + 3) * inch;

        float* g0 = kernel_pack4.channel(q / 4);

        for (int p = 0; p + 3 < inch; p += 4)
        {
            g0[0] = k0[0];
            g0[1] = k1[0];
            g0[2] = k2[0];
            g0[3] = k3[0];

            g0[4] = k0[1];
            g0[5] = k1[1];
            g0[6] = k2[1];
            g0[7] = k3[1];

            g0[8] = k0[2];
            g0[9] = k1[2];
            g0[10] = k2[2];
            g0[11] = k3[2];

            g0[12] = k0[3];
            g0[13] = k1[3];
            g0[14] = k2[3];
            g0[15] = k3[3];

            k0 += 4;
            k1 += 4;
            k2 += 4;
            k3 += 4;
            g0 += 16;
        }
    }
}